

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O3

void __thiscall booster::log::logger::reset_log_level(logger *this,char *module)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_38;
  
  local_38._M_device = &((this->d).ptr_)->entries_lock;
  local_38._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  lVar4 = (long)this->entries_size_;
  if (0 < lVar4) {
    lVar5 = 0;
    do {
      iVar3 = strcmp(*(char **)((long)&this->entries_[0].module + lVar5),module);
      if (iVar3 == 0) {
        uVar2 = *(undefined8 *)&this->entries_[lVar4 + -1].level;
        puVar1 = (undefined8 *)((long)&this->entries_[0].module + lVar5);
        *puVar1 = this->entries_[lVar4 + -1].module;
        puVar1[1] = uVar2;
        iVar3 = this->entries_size_;
        this->entries_size_ = iVar3 + -1;
        this->entries_[(long)iVar3 + -1].module = (char *)0x0;
        break;
      }
      lVar5 = lVar5 + 0x10;
    } while (lVar4 * 0x10 != lVar5);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return;
}

Assistant:

void logger::reset_log_level(char const *module)
	{
		unique_lock<mutex> l(d->entries_lock);
		for(int i=0;i<entries_size_;i++) {
			if(strcmp(entries_[i].module,module)==0) {
				entries_[i]=entries_[entries_size_-1];
				entries_size_--;
				entries_[entries_size_].module = 0;
				return;
			}
		}
	}